

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interlace.c
# Opt level: O0

void FullImage(IceTImage image)

{
  IceTSizeType IVar1;
  IceTSizeType IVar2;
  IceTEnum IVar3;
  float *local_38;
  IceTFloat *data_2;
  IceTFloat *data_1;
  IceTUInt *data;
  IceTSizeType y;
  IceTSizeType x;
  IceTSizeType height;
  IceTSizeType width;
  IceTImage image_local;
  
  IVar1 = icetImageGetWidth(image);
  IVar2 = icetImageGetHeight(image);
  IVar3 = icetImageGetColorFormat(image);
  if (IVar3 == 0xc001) {
    data_1 = (IceTFloat *)icetImageGetColorui(image);
    for (data._0_4_ = 0; (int)(uint)data < IVar2; data._0_4_ = (uint)data + 1) {
      for (data._4_4_ = 0; (int)data._4_4_ < IVar1; data._4_4_ = data._4_4_ + 1) {
        *data_1 = (IceTFloat)(data._4_4_ & 0xffff | 0x8000 | ((uint)data & 0xffff | 0x8000) << 0x10)
        ;
        data_1 = data_1 + 1;
      }
    }
  }
  else {
    IVar3 = icetImageGetColorFormat(image);
    if (IVar3 == 0xc002) {
      data_2 = icetImageGetColorf(image);
      for (data._0_4_ = 0; (int)(uint)data < IVar2; data._0_4_ = (uint)data + 1) {
        for (data._4_4_ = 0; (int)data._4_4_ < IVar1; data._4_4_ = data._4_4_ + 1) {
          *data_2 = (IceTFloat)(float)(int)data._4_4_;
          data_2[1] = (IceTFloat)(float)(int)(uint)data;
          data_2[2] = 0.0;
          data_2[3] = 1.0;
          data_2 = data_2 + 4;
        }
      }
    }
    else {
      IVar3 = icetImageGetColorFormat(image);
      if (IVar3 != 0xc000) {
        printf("ERROR: Encountered unknown color format.");
      }
    }
  }
  IVar3 = icetImageGetDepthFormat(image);
  if (IVar3 == 0xd001) {
    local_38 = (float *)icetImageGetDepthf(image);
    for (data._0_4_ = 0; (int)(uint)data < IVar2; data._0_4_ = (uint)data + 1) {
      for (data._4_4_ = 0; (int)data._4_4_ < IVar1; data._4_4_ = data._4_4_ + 1) {
        *local_38 = ((float)(int)(data._4_4_ + (uint)data) + 1.0) / 10000.0;
        local_38 = local_38 + 1;
      }
    }
  }
  else {
    IVar3 = icetImageGetDepthFormat(image);
    if (IVar3 != 0xd000) {
      printf("ERROR: Encountered unknown depth format.");
    }
  }
  return;
}

Assistant:

static void FullImage(IceTImage image)
{
    IceTSizeType width = icetImageGetWidth(image);
    IceTSizeType height = icetImageGetHeight(image);
    IceTSizeType x, y;

    if (icetImageGetColorFormat(image) == ICET_IMAGE_COLOR_RGBA_UBYTE) {
        IceTUInt *data = icetImageGetColorui(image);
        for (y = 0; y < height; y++) {
            for (x = 0; x < width; x++) {
                data[0] = ACTIVE_COLOR(x, y);
                data++;
            }
        }
    } else if (icetImageGetColorFormat(image) == ICET_IMAGE_COLOR_RGBA_FLOAT) {
        IceTFloat *data = icetImageGetColorf(image);
        for (y = 0; y < height; y++) {
            for (x = 0; x < width; x++) {
                data[0] = (float)x;
                data[1] = (float)y;
                data[2] = 0.0;
                data[3] = 1.0;
                data += 4;
            }
        }
    } else if (icetImageGetColorFormat(image) == ICET_IMAGE_COLOR_NONE) {
        /* Do nothing. */
    } else {
        printf("ERROR: Encountered unknown color format.");
    }

    if (icetImageGetDepthFormat(image) == ICET_IMAGE_DEPTH_FLOAT) {
        IceTFloat *data = icetImageGetDepthf(image);
        for (y = 0; y < height; y++) {
            for (x = 0; x < width; x++) {
                data[0] = ACTIVE_DEPTH(x, y);
                data++;
            }
        }
    } else if (icetImageGetDepthFormat(image) == ICET_IMAGE_DEPTH_NONE) {
        /* Do nothing. */
    } else {
        printf("ERROR: Encountered unknown depth format.");
    }
}